

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O2

double __thiscall alex::ExpectedShiftsAccumulator::get_stat(ExpectedShiftsAccumulator *this)

{
  long lVar1;
  
  if (this->count_ != 0) {
    lVar1 = (long)((this->last_position_ - this->dense_region_start_idx_) + 1);
    return (double)(long)(((ulong)(lVar1 * lVar1) >> 2) + this->num_expected_shifts_) /
           (double)this->count_;
  }
  return 0.0;
}

Assistant:

double get_stat() override {
    if (count_ == 0) return 0;
    // first need to accumulate statistics for current packed region
    long long dense_region_length = last_position_ - dense_region_start_idx_ + 1;
    long long cur_num_expected_shifts =
        num_expected_shifts_ + (dense_region_length * dense_region_length) / 4;
    return cur_num_expected_shifts / static_cast<double>(count_);
  }